

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcRtFileFont.cpp
# Opt level: O0

byte * __thiscall GrcRtFileFont::readTable(GrcRtFileFont *this,int tid,size_t *size)

{
  bool bVar1;
  size_t sVar2;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  byte bVar3;
  size_t bytesRead;
  byte *pTable;
  size_t lSize;
  size_t lOffset;
  bool isValid;
  TableId tableId;
  long __off;
  undefined3 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  uVar4 = CONCAT13(1,in_stack_ffffffffffffffd8);
  __off = 0;
  *in_RDX = 0;
  bVar1 = TtfUtil::GetTableInfo
                    ((TableId)in_RDI,(void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                     (size_t *)CONCAT44(in_ESI,uVar4),(size_t *)0x0);
  if (((byte)((uint)uVar4 >> 0x18) & 1 & bVar1) == 0) {
    local_8 = (byte *)0x0;
  }
  else {
    fseek(*(FILE **)(in_RDI + 8),__off,0);
    local_8 = (byte *)operator_new__(0);
    if (local_8 == (byte *)0x0) {
      local_8 = (byte *)0x0;
    }
    else {
      sVar2 = fread(local_8,1,0,*(FILE **)(in_RDI + 8));
      bVar3 = (int)sVar2 == 0;
      if ((bool)bVar3) {
        bVar1 = TtfUtil::CheckTable((TableId)lSize,pTable,bytesRead);
        bVar3 = (bVar3 & 1 & bVar1) != 0;
      }
      if ((bool)bVar3) {
        *in_RDX = 0;
      }
      else {
        local_8 = (byte *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

gr::byte * GrcRtFileFont::readTable(int /*TableId*/ tid, size_t & size)
{
	TableId tableId = static_cast<TableId>(tid);
	bool isValid = true;
	size_t lOffset = 0, lSize = 0;
	//if (!m_pTableCache)
	//{
	//	m_pTableCache = new FontTableCache();		
	//}
	//if (!m_pTableCache) return NULL;
	
	gr::byte * pTable = NULL; // m_pTableCache->getTable(tableId);
	size = 0; // m_pTableCache->getTableSize(tableId);
	// check whether it is already in the cache
	//if (pTable) return pTable;
	isValid &= TtfUtil::GetTableInfo(tableId, m_pHeader, m_pTableDir, 
									  lOffset, lSize);
	if (!isValid) 
		return NULL;
	fseek(m_file, lOffset, SEEK_SET);

	//pTable = m_pTableCache->allocateTable(tableId, lSize);
	pTable = new gr::byte[lSize]; 
	if (!pTable) 
	{
		isValid = false;
		return NULL;
	}
	size_t bytesRead = fread(pTable, 1, lSize, m_file);
	isValid = (static_cast<int>(bytesRead) == lSize);
	if (isValid)
	{
		isValid &= TtfUtil::CheckTable(tableId, pTable, lSize);
	}
	if (!isValid) 
	{
		return NULL;
	}
	size = lSize;
	return pTable;
}